

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_build_lut(uint64_t max_cw_len)

{
  bool bVar1;
  int64_t j;
  int64_t i;
  uint64_t min;
  uint64_t max;
  uint64_t max_cw_len_local;
  
  j = max_cw_len - 1;
  for (i = 0; i < 0x100; i = i + 1) {
    while( true ) {
      bVar1 = false;
      if (-1 < j) {
        bVar1 = shuff_lj_base[j] < (i << 0x38 | 0xffffffffffffffU);
      }
      if (!bVar1) break;
      j = j + -1;
    }
    if ((ulong)(i << 0x38) < shuff_lj_base[j + 1]) {
      shuff_lut[i] = (uint64_t *)0x0;
    }
    else {
      shuff_lut[i] = (uint64_t *)(j * 8 + 0x1f0908);
    }
  }
  return;
}

Assistant:

void shuff_build_lut(uint64_t max_cw_len)
{
    uint64_t max, min; // range of left justified "i"
    int64_t i, j = max_cw_len - 1; // pointer into lj

    for (i = 0; i < SHUFF_LUT_SIZE; i++) {
        min = i << ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS);
        max = min | SHUFF_MAX_IT;

        while ((j >= 0) && (max > shuff_lj_base[j]))
            j--;

        // we know max is in range of lj[j], so check min
        if (min >= shuff_lj_base[j + 1])
            shuff_lut[i] = shuff_lj_base + j + 1;
        else
            shuff_lut[i] = NULL; //-(j+1);
    }
}